

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::setColumnWidths(QColumnView *this,QList<int> *list)

{
  QList<int> *this_00;
  int iVar1;
  long lVar2;
  QWidget *this_01;
  QWidgetData *pQVar3;
  int iVar4;
  pointer piVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong asize;
  
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  iVar4 = (int)(list->d).size;
  asize = (ulong)iVar4;
  uVar6 = *(ulong *)(lVar2 + 0x550);
  if ((long)asize <= (long)*(ulong *)(lVar2 + 0x550)) {
    uVar6 = asize;
  }
  this_00 = (QList<int> *)(lVar2 + 0x558);
  uVar8 = 0;
  uVar7 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    this_01 = *(QWidget **)(*(long *)(lVar2 + 0x548) + uVar8 * 8);
    pQVar3 = this_01->data;
    QWidget::resize(this_01,(list->d).ptr[uVar8],
                    ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1);
    iVar1 = (list->d).ptr[uVar8];
    piVar5 = QList<int>::data(this_00);
    piVar5[uVar8] = iVar1;
  }
  QList<int>::reserve(this_00,asize);
  for (; (long)uVar7 < (long)iVar4; uVar7 = uVar7 + 1) {
    QList<int>::append(this_00,(list->d).ptr[uVar7]);
  }
  return;
}

Assistant:

void QColumnView::setColumnWidths(const QList<int> &list)
{
    Q_D(QColumnView);
    int i = 0;
    const int listCount = list.size();
    const int count = qMin(listCount, d->columns.size());
    for (; i < count; ++i) {
        d->columns.at(i)->resize(list.at(i), d->columns.at(i)->height());
        d->columnSizes[i] = list.at(i);
    }

    d->columnSizes.reserve(listCount);
    for (; i < listCount; ++i)
        d->columnSizes.append(list.at(i));
}